

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexTools.c
# Opt level: O3

int Bmc_CexBitCount(Abc_Cex_t *p,int nInputs)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  ulong in_XMM4_Qa;
  uint uVar9;
  undefined8 in_XMM4_Qb;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar19 [16];
  
  if (p == (Abc_Cex_t *)0x0) {
    puts("The counter example is NULL.");
    iVar7 = -1;
  }
  else {
    iVar7 = p->nBits;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    else {
      iVar1 = p->nRegs;
      iVar2 = p->nPis;
      iVar4 = iVar7 + -1;
      auVar6._4_4_ = iVar4;
      auVar6._0_4_ = iVar4;
      auVar6._8_4_ = iVar4;
      auVar6._12_4_ = iVar4;
      uVar5 = 0;
      auVar6 = auVar6 ^ _DAT_0093d220;
      auVar13 = _DAT_0094a000;
      auVar11 = (undefined1  [16])0x0;
      do {
        auVar15 = auVar11;
        auVar11 = auVar13 ^ _DAT_0093d220;
        auVar12._0_4_ = -(uint)(auVar6._0_4_ < auVar11._0_4_);
        auVar12._4_4_ = -(uint)(auVar6._4_4_ < auVar11._4_4_);
        auVar12._8_4_ = -(uint)(auVar6._8_4_ < auVar11._8_4_);
        auVar12._12_4_ = -(uint)(auVar6._12_4_ < auVar11._12_4_);
        if ((~auVar12._0_4_ & 1) != 0) {
          in_XMM4_Qa = (ulong)(uint)(&p[1].iPo)[uVar5 >> 5];
          in_XMM4_Qb = 0;
        }
        auVar11 = auVar12 ^ _DAT_00983080;
        if ((auVar11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          in_XMM4_Qa = CONCAT44((&p[1].iPo)[uVar5 >> 5],(int)in_XMM4_Qa);
        }
        uVar8 = (uint)in_XMM4_Qa;
        if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          in_XMM4_Qb = CONCAT44((int)((ulong)in_XMM4_Qb >> 0x20),(&p[1].iPo)[uVar5 >> 5]);
        }
        auVar16 = auVar11;
        if ((auVar11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          auVar16._4_4_ = 0;
          auVar16._0_4_ = (&p[1].iPo)[uVar5 >> 5];
          auVar16._8_4_ = (int)in_XMM4_Qb;
          auVar16._12_4_ = (int)((ulong)in_XMM4_Qb >> 0x20);
          in_XMM4_Qb = CONCAT44((&p[1].iPo)[uVar5 >> 5],(int)in_XMM4_Qb);
        }
        if ((~auVar12._0_4_ & 1) != 0) {
          auVar16 = ZEXT416((uint)((int)(uVar5 - iVar1) % iVar2));
        }
        if ((auVar11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          auVar16._4_4_ = (int)((1 - iVar1) + uVar5) % iVar2;
        }
        if ((auVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          auVar16._8_4_ = (int)((2 - iVar1) + uVar5) % iVar2;
        }
        if ((auVar11 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          auVar16._12_4_ = (int)((3 - iVar1) + uVar5) % iVar2;
        }
        auVar11 = auVar13 & _DAT_009d0940;
        auVar17 = pshuflw(auVar16,auVar11,0xfe);
        uVar3 = in_XMM4_Qa >> 0x20;
        auVar19 = pshuflw(in_XMM15,auVar11,0x54);
        uVar10 = (uint)((ulong)in_XMM4_Qb >> 0x20);
        auVar18._8_4_ = auVar11._8_4_;
        auVar18._12_4_ = auVar11._12_4_;
        auVar18._0_8_ = auVar11._8_8_;
        in_XMM15 = pshuflw(auVar19,auVar18,0xfe);
        uVar14 = uVar10 >> in_XMM15._0_8_;
        auVar11 = pshuflw(auVar18,auVar18,0x54);
        uVar9 = (uint)in_XMM4_Qb >> auVar11._0_8_;
        in_XMM4_Qa = CONCAT44(uVar10 >> auVar11._0_8_,uVar9);
        in_XMM4_Qb = CONCAT44(uVar14,(uint)in_XMM4_Qb >> in_XMM15._0_8_);
        auVar11._0_4_ =
             (uVar8 >> auVar19._0_8_ & -(uint)(auVar16._0_4_ < nInputs) & 1) + auVar15._0_4_;
        auVar11._4_4_ =
             ((uint)uVar3 >> auVar17._0_8_ & -(uint)(auVar16._4_4_ < nInputs) & 1) + auVar15._4_4_;
        auVar11._8_4_ = (uVar9 & -(uint)(auVar16._8_4_ < nInputs) & 1) + auVar15._8_4_;
        auVar11._12_4_ = (uVar14 & -(uint)(auVar16._12_4_ < nInputs) & 1) + auVar15._12_4_;
        uVar5 = uVar5 + 4;
        auVar17._0_4_ = auVar13._0_4_ + 4;
        auVar17._4_4_ = auVar13._4_4_ + 4;
        auVar17._8_4_ = auVar13._8_4_ + 4;
        auVar17._12_4_ = auVar13._12_4_ + 4;
        auVar13 = auVar17;
      } while ((iVar7 + 3U & 0xfffffffc) != uVar5);
      auVar13 = ~auVar12 & auVar11 | auVar15 & auVar12;
      iVar7 = auVar13._12_4_ + auVar13._4_4_ + auVar13._8_4_ + auVar13._0_4_;
    }
  }
  return iVar7;
}

Assistant:

int Bmc_CexBitCount( Abc_Cex_t * p, int nInputs )
{
    int k, Counter = 0, Counter2 = 0;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return -1;
    }
    for ( k = 0; k < p->nBits; k++ )
    {
        Counter += Abc_InfoHasBit(p->pData, k);
        if ( (k - p->nRegs) % p->nPis < nInputs )
            Counter2 += Abc_InfoHasBit(p->pData, k);
    }
    return Counter2;
}